

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zap_client.cpp
# Opt level: O3

void __thiscall
zmq::zap_client_t::send_zap_request
          (zap_client_t *this,char *mechanism_,size_t mechanism_length_,uint8_t **credentials_,
          size_t *credentials_sizes_,size_t credentials_count_)

{
  int iVar1;
  undefined2 *puVar2;
  undefined1 *puVar3;
  void *pvVar4;
  ulong uVar5;
  msg_t msg;
  msg_t mStack_78;
  uint8_t **local_38;
  
  local_38 = credentials_;
  iVar1 = msg_t::init(&mStack_78,(EVP_PKEY_CTX *)mechanism_);
  if (iVar1 != 0) {
    send_zap_request();
  }
  msg_t::set_flags(&mStack_78,'\x01');
  iVar1 = session_base_t::write_zap_msg
                    (*(session_base_t **)(&this->field_0x590 + (long)this->_vptr_zap_client_t[-3]),
                     &mStack_78);
  if (iVar1 != 0) {
    send_zap_request();
  }
  iVar1 = msg_t::init_size(&mStack_78,3);
  if (iVar1 != 0) {
    send_zap_request();
  }
  puVar2 = (undefined2 *)msg_t::data(&mStack_78);
  *puVar2 = 0x2e31;
  *(undefined1 *)(puVar2 + 1) = 0x30;
  msg_t::set_flags(&mStack_78,'\x01');
  iVar1 = session_base_t::write_zap_msg
                    (*(session_base_t **)(&this->field_0x590 + (long)this->_vptr_zap_client_t[-3]),
                     &mStack_78);
  if (iVar1 != 0) {
    send_zap_request();
  }
  iVar1 = msg_t::init_size(&mStack_78,1);
  if (iVar1 != 0) {
    send_zap_request();
  }
  puVar3 = (undefined1 *)msg_t::data(&mStack_78);
  *puVar3 = 0x31;
  msg_t::set_flags(&mStack_78,'\x01');
  iVar1 = session_base_t::write_zap_msg
                    (*(session_base_t **)(&this->field_0x590 + (long)this->_vptr_zap_client_t[-3]),
                     &mStack_78);
  if (iVar1 != 0) {
    send_zap_request();
  }
  iVar1 = msg_t::init_size(&mStack_78,
                           *(size_t *)(&this->field_0x2a8 + (long)this->_vptr_zap_client_t[-3]));
  if (iVar1 != 0) {
    send_zap_request();
  }
  pvVar4 = msg_t::data(&mStack_78);
  memcpy(pvVar4,*(void **)(&this->field_0x2a0 + (long)this->_vptr_zap_client_t[-3]),
         *(size_t *)(&this->field_0x2a8 + (long)this->_vptr_zap_client_t[-3]));
  msg_t::set_flags(&mStack_78,'\x01');
  iVar1 = session_base_t::write_zap_msg
                    (*(session_base_t **)(&this->field_0x590 + (long)this->_vptr_zap_client_t[-3]),
                     &mStack_78);
  if (iVar1 != 0) {
    send_zap_request();
  }
  iVar1 = msg_t::init_size(&mStack_78,(this->peer_address)._M_string_length);
  if (iVar1 != 0) {
    send_zap_request();
  }
  pvVar4 = msg_t::data(&mStack_78);
  memcpy(pvVar4,(this->peer_address)._M_dataplus._M_p,(this->peer_address)._M_string_length);
  msg_t::set_flags(&mStack_78,'\x01');
  iVar1 = session_base_t::write_zap_msg
                    (*(session_base_t **)(&this->field_0x590 + (long)this->_vptr_zap_client_t[-3]),
                     &mStack_78);
  if (iVar1 != 0) {
    send_zap_request();
  }
  iVar1 = msg_t::init_size(&mStack_78,
                           (ulong)(byte)(this->_vptr_zap_client_t[-3] + 0x10)
                                        [(long)&(this->peer_address)._M_dataplus]);
  if (iVar1 != 0) {
    send_zap_request();
  }
  pvVar4 = msg_t::data(&mStack_78);
  memcpy(pvVar4,this->_vptr_zap_client_t[-3] + 0x11 + (long)&(this->peer_address)._M_dataplus,
         (ulong)(byte)(this->_vptr_zap_client_t[-3] + 0x10)[(long)&(this->peer_address)._M_dataplus]
        );
  msg_t::set_flags(&mStack_78,'\x01');
  iVar1 = session_base_t::write_zap_msg
                    (*(session_base_t **)(&this->field_0x590 + (long)this->_vptr_zap_client_t[-3]),
                     &mStack_78);
  if (iVar1 != 0) {
    send_zap_request();
  }
  iVar1 = msg_t::init_size(&mStack_78,mechanism_length_);
  if (iVar1 != 0) {
    send_zap_request();
  }
  pvVar4 = msg_t::data(&mStack_78);
  memcpy(pvVar4,mechanism_,mechanism_length_);
  if (credentials_count_ != 0) {
    msg_t::set_flags(&mStack_78,'\x01');
  }
  iVar1 = session_base_t::write_zap_msg
                    (*(session_base_t **)(&this->field_0x590 + (long)this->_vptr_zap_client_t[-3]),
                     &mStack_78);
  if (iVar1 != 0) {
    send_zap_request();
  }
  if (credentials_count_ != 0) {
    uVar5 = 0;
    do {
      iVar1 = msg_t::init_size(&mStack_78,credentials_sizes_[uVar5]);
      if (iVar1 != 0) {
        send_zap_request();
      }
      if (uVar5 < credentials_count_ - 1) {
        msg_t::set_flags(&mStack_78,'\x01');
      }
      pvVar4 = msg_t::data(&mStack_78);
      memcpy(pvVar4,local_38[uVar5],credentials_sizes_[uVar5]);
      iVar1 = session_base_t::write_zap_msg
                        (*(session_base_t **)
                          (&this->field_0x590 + (long)this->_vptr_zap_client_t[-3]),&mStack_78);
      if (iVar1 != 0) {
        send_zap_request();
      }
      uVar5 = uVar5 + 1;
    } while (credentials_count_ != uVar5);
  }
  return;
}

Assistant:

void zap_client_t::send_zap_request (const char *mechanism_,
                                     size_t mechanism_length_,
                                     const uint8_t **credentials_,
                                     size_t *credentials_sizes_,
                                     size_t credentials_count_)
{
    // write_zap_msg cannot fail. It could only fail if the HWM was exceeded,
    // but on the ZAP socket, the HWM is disabled.

    int rc;
    msg_t msg;

    //  Address delimiter frame
    rc = msg.init ();
    errno_assert (rc == 0);
    msg.set_flags (msg_t::more);
    rc = session->write_zap_msg (&msg);
    errno_assert (rc == 0);

    //  Version frame
    rc = msg.init_size (zap_version_len);
    errno_assert (rc == 0);
    memcpy (msg.data (), zap_version, zap_version_len);
    msg.set_flags (msg_t::more);
    rc = session->write_zap_msg (&msg);
    errno_assert (rc == 0);

    //  Request ID frame
    rc = msg.init_size (id_len);
    errno_assert (rc == 0);
    memcpy (msg.data (), id, id_len);
    msg.set_flags (msg_t::more);
    rc = session->write_zap_msg (&msg);
    errno_assert (rc == 0);

    //  Domain frame
    rc = msg.init_size (options.zap_domain.length ());
    errno_assert (rc == 0);
    memcpy (msg.data (), options.zap_domain.c_str (),
            options.zap_domain.length ());
    msg.set_flags (msg_t::more);
    rc = session->write_zap_msg (&msg);
    errno_assert (rc == 0);

    //  Address frame
    rc = msg.init_size (peer_address.length ());
    errno_assert (rc == 0);
    memcpy (msg.data (), peer_address.c_str (), peer_address.length ());
    msg.set_flags (msg_t::more);
    rc = session->write_zap_msg (&msg);
    errno_assert (rc == 0);

    //  Routing id frame
    rc = msg.init_size (options.routing_id_size);
    errno_assert (rc == 0);
    memcpy (msg.data (), options.routing_id, options.routing_id_size);
    msg.set_flags (msg_t::more);
    rc = session->write_zap_msg (&msg);
    errno_assert (rc == 0);

    //  Mechanism frame
    rc = msg.init_size (mechanism_length_);
    errno_assert (rc == 0);
    memcpy (msg.data (), mechanism_, mechanism_length_);
    if (credentials_count_)
        msg.set_flags (msg_t::more);
    rc = session->write_zap_msg (&msg);
    errno_assert (rc == 0);

    //  Credentials frames
    for (size_t i = 0; i < credentials_count_; ++i) {
        rc = msg.init_size (credentials_sizes_[i]);
        errno_assert (rc == 0);
        if (i < credentials_count_ - 1)
            msg.set_flags (msg_t::more);
        memcpy (msg.data (), credentials_[i], credentials_sizes_[i]);
        rc = session->write_zap_msg (&msg);
        errno_assert (rc == 0);
    }
}